

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneloader.h
# Opt level: O0

Material *
json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *c)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  mapped_type *ppMVar4;
  ostream *poVar5;
  key_type *__k;
  mapped_type pMVar6;
  MirrorMaterial *this;
  float fVar7;
  string d;
  Texture *in_stack_fffffffffffffb58;
  key_type *in_stack_fffffffffffffb68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
  *in_stack_fffffffffffffb70;
  Texture *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  undefined8 in_stack_fffffffffffffb88;
  SolidGlassMaterial *in_stack_fffffffffffffb90;
  Texture *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  char *in_stack_fffffffffffffc78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffc80;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffcb8;
  float in_stack_fffffffffffffcf4;
  Texture *in_stack_fffffffffffffcf8;
  Texture *in_stack_fffffffffffffd00;
  float in_stack_fffffffffffffd0c;
  GlassMaterial *in_stack_fffffffffffffd10;
  error_handler_t in_stack_fffffffffffffe2c;
  undefined1 in_stack_fffffffffffffe32;
  char in_stack_fffffffffffffe33;
  int in_stack_fffffffffffffe34;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffe38;
  string local_30 [40];
  mapped_type local_8;
  
  fVar7 = (float)((ulong)in_stack_fffffffffffffb88 >> 0x20);
  if (json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
      ::mat_map_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
                                 ::mat_map_abi_cxx11_);
    if (iVar2 != 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
             *)0x357b15);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                   ::~map,&json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
                           ::mat_map_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&json_parse_material<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)
                           ::mat_map_abi_cxx11_);
    }
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe33,
         (bool)in_stack_fffffffffffffe32,in_stack_fffffffffffffe2c);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
          ::count(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  if (sVar3 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"new mat: ");
    poVar5 = std::operator<<(poVar5,local_30);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    bVar1 = nlohmann::operator==<const_char_*,_0>
                      ((const_reference)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (char *)in_stack_fffffffffffffb78);
    if (bVar1) {
      pMVar6 = (mapped_type)operator_new(0x148);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (in_stack_fffffffffffffcb8);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (in_stack_fffffffffffffcb8);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator_float<float,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)0x357d2c);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (in_stack_fffffffffffffcb8);
      BRDFMaterial::BRDFMaterial
                ((BRDFMaterial *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                 in_stack_fffffffffffffb98,(Texture *)in_stack_fffffffffffffb90,fVar7,
                 (Texture *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      ppMVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                              *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                             (key_type *)in_stack_fffffffffffffb98);
      *ppMVar4 = pMVar6;
      local_8 = pMVar6;
      Texture::~Texture((Texture *)0x357dea);
      Texture::~Texture((Texture *)0x357df7);
      Texture::~Texture((Texture *)0x357e04);
    }
    else {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      bVar1 = nlohmann::operator==<const_char_*,_0>
                        ((const_reference)
                         CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                         (char *)in_stack_fffffffffffffb78);
      if (bVar1) {
        pMVar6 = (mapped_type)operator_new(0xe0);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator_float<float,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)0x357f31);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  (in_stack_fffffffffffffcb8);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  (in_stack_fffffffffffffcb8);
        SolidGlassMaterial::SolidGlassMaterial
                  (in_stack_fffffffffffffb90,fVar7,
                   (Texture *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   in_stack_fffffffffffffb78);
        ppMVar4 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                                *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                               (key_type *)in_stack_fffffffffffffb98);
        *ppMVar4 = pMVar6;
        local_8 = pMVar6;
        Texture::~Texture((Texture *)0x35800a);
        Texture::~Texture((Texture *)0x358017);
      }
      else {
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
        bVar1 = nlohmann::operator==<const_char_*,_0>
                          ((const_reference)
                           CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                           (char *)in_stack_fffffffffffffb78);
        if (bVar1) {
          pMVar6 = (mapped_type)operator_new(0xf0);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          fVar7 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::operator_float<float,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)0x358112);
          __k = (key_type *)
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    (in_stack_fffffffffffffcb8);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    (in_stack_fffffffffffffcb8);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator_float<float,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)0x35819d);
          GlassMaterial::GlassMaterial
                    (in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,in_stack_fffffffffffffd00,
                     in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4);
          ppMVar4 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                                  *)CONCAT44(fVar7,in_stack_fffffffffffffba0),__k);
          *ppMVar4 = pMVar6;
          local_8 = pMVar6;
          Texture::~Texture((Texture *)0x358212);
          Texture::~Texture((Texture *)0x35821f);
        }
        else {
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          bVar1 = nlohmann::operator==<const_char_*,_0>
                            ((const_reference)
                             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                             (char *)in_stack_fffffffffffffb78);
          if (!bVar1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/sceneloader.h"
                          ,0x67,
                          "Material *json_parse_material(const T &) [T = nlohmann::basic_json<>]");
          }
          pMVar6 = (mapped_type)operator_new(0x70);
          this = (MirrorMaterial *)
                 nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          json_to_texture<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    (in_stack_fffffffffffffcb8);
          MirrorMaterial::MirrorMaterial(this,in_stack_fffffffffffffb58);
          ppMVar4 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 (key_type *)in_stack_fffffffffffffb98);
          *ppMVar4 = pMVar6;
          local_8 = pMVar6;
          Texture::~Texture((Texture *)0x358378);
        }
      }
    }
  }
  else {
    ppMVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Material_*>_>_>
                            *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                           (key_type *)in_stack_fffffffffffffb98);
    local_8 = *ppMVar4;
  }
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

Material* json_parse_material(const T& c)
{
	static std::map<std::string, Material*> mat_map;
	std::string d = c.dump();
	if (mat_map.count(d)) return mat_map[d];
	std::cerr << "new mat: " << d << std::endl;
	if(c["type"]=="BRDFMaterial") {
		return mat_map[d] = new BRDFMaterial(json_to_texture(c["dc"]), json_to_texture(c["sc"]), c["r"], json_to_texture(c["ec"]));
	}
	else if (c["type"] == "SolidGlassMaterial") {
		return mat_map[d] = new SolidGlassMaterial(float(c["n"]), json_to_texture(c["reflectc"]), json_to_texture(c["refractc"]));
	}
	else if (c["type"] == "GlassMaterial") {
		return mat_map[d] = new GlassMaterial(float(c["n"]), json_to_texture(c["reflectc"]), json_to_texture(c["refractc"]), float(c["t"]));
	}
	else if (c["type"] == "MirrorMaterial") {
		return mat_map[d] = new MirrorMaterial(json_to_texture(c["c"]));
	}
	else assert(0);
}